

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Maybe<kj::String_&> __thiscall
kj::HashMap<kj::ReadableDirectory_const*,kj::String>::find<kj::ReadableDirectory_const*>
          (HashMap<kj::ReadableDirectory_const*,kj::String> *this,ReadableDirectory **key)

{
  Maybe<kj::String_&> MVar1;
  long lVar2;
  ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> table;
  HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
  find<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
            (local_20,table,
             (ReadableDirectory **)((long)(*(long *)(this + 8) - *(size_t *)this) >> 5));
  lVar2 = 0;
  if (local_20[0] != (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x0
     ) {
    lVar2 = local_18 * 0x20 + *(long *)this;
  }
  MVar1.ptr = (String *)(lVar2 + 8);
  if (lVar2 == 0) {
    MVar1.ptr = (String *)0x0;
  }
  return (Maybe<kj::String_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}